

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,int64_t number,UnicodeString *appendTo,FieldPositionIterator *posIter
          ,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int32_t offset;
  FormattedNumber output;
  UnicodeStringAppendable appendable;
  undefined1 auStack_48 [24];
  UnicodeString *local_30;
  
  if ((posIter == (FieldPositionIterator *)0x0) &&
     (bVar2 = fastFormatInt64(this,number,appendTo), bVar2)) {
    return appendTo;
  }
  icu_63::number::LocalizedNumberFormatter::formatInt
            ((LocalizedNumberFormatter *)auStack_48,
             (int64_t)(this->fields->formatter).
                      super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,
             (UErrorCode *)number);
  sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    offset = (appendTo->fUnion).fFields.fLength;
  }
  else {
    offset = (int)sVar1 >> 5;
  }
  fieldPositionIteratorHelper((FormattedNumber *)auStack_48,posIter,offset,status);
  auStack_48._16_8_ = &PTR__UnicodeStringAppendable_00471ee8;
  local_30 = appendTo;
  icu_63::number::FormattedNumber::appendTo
            ((FormattedNumber *)auStack_48,(Appendable *)(auStack_48 + 0x10));
  UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)(auStack_48 + 0x10));
  icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)auStack_48);
  return appendTo;
}

Assistant:

UnicodeString&
DecimalFormat::format(int64_t number, UnicodeString& appendTo, FieldPositionIterator* posIter,
                      UErrorCode& status) const {
    if (posIter == nullptr && fastFormatInt64(number, appendTo)) {
        return appendTo;
    }
    FormattedNumber output = fields->formatter->formatInt(number, status);
    fieldPositionIteratorHelper(output, posIter, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}